

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

BoxArray * __thiscall amrex::BoxArray::grow(BoxArray *this,IntVect *iv)

{
  Long LVar1;
  Box *this_00;
  IntVect *in_RSI;
  BoxArray *in_RDI;
  int i;
  int N;
  BoxArray *in_stack_00000138;
  size_type in_stack_ffffffffffffffd8;
  undefined4 local_18;
  
  uniqify(in_stack_00000138);
  std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0xfbd3bb
            );
  LVar1 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::size
                    ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0xfbd3c3);
  for (local_18 = 0; local_18 < (int)LVar1; local_18 = local_18 + 1) {
    std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0xfbd3e7);
    this_00 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                        ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)in_RDI,
                         in_stack_ffffffffffffffd8);
    Box::grow(this_00,in_RSI);
  }
  return in_RDI;
}

Assistant:

BoxArray&
BoxArray::grow (const IntVect& iv)
{
    uniqify();

    const int N = m_ref->m_abox.size();
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
    for (int i = 0; i < N; i++) {
        m_ref->m_abox[i].grow(iv);
    }
    return *this;
}